

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusIntersect.cpp
# Opt level: O0

int GeoCalcs::LocusIntersect(Locus *loc1,Locus *loc2,LLPoint *intersect,double dTol,double dEps)

{
  double az13;
  bool bVar1;
  uint uVar2;
  LLPoint LVar3;
  undefined1 local_170 [8];
  LLPoint pint2;
  int local_13c;
  double dStack_138;
  int k;
  double dErr;
  double dStack_128;
  int maxCount;
  double errarray [2];
  double distarray [2];
  undefined1 local_100 [8];
  LLPoint ploc2;
  LLPoint ploc1;
  double distbase;
  PtIsOnGeodesicResult ptResult;
  LLPoint pint1;
  double dDistFromP;
  double dCrsFromPt;
  double tcrs2;
  double tcrs1;
  LLPoint p1;
  double crs2;
  double crs1;
  InverseResult result;
  double dEps_local;
  double dTol_local;
  LLPoint *intersect_local;
  Locus *loc2_local;
  Locus *loc1_local;
  
  result.distance = dEps;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&crs1);
  DistVincenty(&loc1->locusStart,&loc1->locusEnd,(InverseResult *)&crs1);
  az13 = crs1;
  DistVincenty(&loc2->locusStart,&loc2->locusEnd,(InverseResult *)&crs1);
  p1.longitude = crs1;
  LLPOINT::LLPOINT((LLPOINT *)&tcrs1);
  bVar1 = CrsIntersect(&loc1->locusStart,az13,&loc2->locusStart,p1.longitude,dTol,(LLPoint *)&tcrs1)
  ;
  if (bVar1) {
    DistVincenty(&loc1->geoStart,&loc1->geoEnd,(InverseResult *)&crs1);
    tcrs2 = crs1;
    DistVincenty(&loc2->geoStart,&loc2->geoEnd,(InverseResult *)&crs1);
    dCrsFromPt = crs1;
    LVar3 = PerpIntercept(&loc1->geoStart,tcrs2,(LLPoint *)&tcrs1,&dDistFromP,&pint1.longitude,dTol)
    ;
    ptResult._48_8_ = LVar3.latitude;
    pint1.latitude = LVar3.longitude;
    PTISONGEODESIC_RESULT::PTISONGEODESIC_RESULT((PTISONGEODESIC_RESULT *)&distbase);
    bVar1 = PtIsOnGeodesic(&loc1->geoStart,&loc1->geoEnd,(LLPoint *)&ptResult.lengthCode,0,
                           (PtIsOnGeodesicResult *)&distbase);
    if ((bVar1) && (ptResult.geoPt.longitude._4_4_ != 0)) {
      DistVincenty(&loc1->geoStart,(LLPoint *)&ptResult.lengthCode,(InverseResult *)&crs1);
      ploc1.longitude = result.reverseAzimuth;
      LLPOINT::LLPOINT((LLPOINT *)&ploc2.longitude);
      LLPOINT::LLPOINT((LLPOINT *)local_100);
      errarray[0] = 0.0;
      dStack_128 = 0.0;
      distarray[0] = 0.0;
      errarray[1] = 0.0;
      dStack_138 = 0.0;
      local_13c = 0;
      while( true ) {
        bVar1 = true;
        if (local_13c != 0) {
          uVar2 = std::isnan(ploc1.longitude);
          bVar1 = false;
          if (((uVar2 & 1) == 0) && (bVar1 = false, local_13c < 0xf)) {
            bVar1 = dTol < ABS(dStack_138);
          }
        }
        if (!bVar1) break;
        if (0 < local_13c) {
          LVar3 = DestVincenty(&loc1->geoStart,tcrs2,ploc1.longitude);
          ptResult._48_8_ = LVar3.latitude;
          pint1.latitude = LVar3.longitude;
        }
        LVar3 = PointOnLocusP(loc1,(LLPoint *)&ptResult.lengthCode,dTol,result.distance);
        pint2.longitude = LVar3.latitude;
        ploc1.latitude = LVar3.longitude;
        ploc2.longitude = pint2.longitude;
        LVar3 = PerpIntercept(&loc2->geoStart,dCrsFromPt,(LLPoint *)&ploc2.longitude,&dDistFromP,
                              &pint1.longitude,dTol);
        local_170 = (undefined1  [8])LVar3.latitude;
        pint2.latitude = LVar3.longitude;
        LVar3 = PointOnLocusP(loc2,(LLPoint *)local_170,dTol,result.distance);
        local_100 = (undefined1  [8])LVar3.latitude;
        ploc2.latitude = LVar3.longitude;
        DistVincenty((LLPoint *)&ploc2.longitude,(LLPoint *)local_100,(InverseResult *)&crs1);
        dStack_138 = result.reverseAzimuth;
        dStack_128 = errarray[0];
        errarray[0] = result.reverseAzimuth;
        errarray[1] = distarray[0];
        distarray[0] = ploc1.longitude;
        if (local_13c == 0) {
          LVar3 = PerpIntercept(&loc1->geoStart,tcrs2,(LLPoint *)local_100,&dDistFromP,
                                &pint1.longitude,dTol);
          ptResult._48_8_ = LVar3.latitude;
          pint1.latitude = LVar3.longitude;
          DistVincenty(&loc1->geoStart,(LLPoint *)&ptResult.lengthCode,(InverseResult *)&crs1);
          ploc1.longitude = result.reverseAzimuth;
        }
        else {
          FindLinearRoot(errarray + 1,&stack0xfffffffffffffed8,&ploc1.longitude);
        }
        local_13c = local_13c + 1;
      }
      bVar1 = PtIsOnLocus(loc1,(LLPoint *)&ploc2.longitude,1e-06);
      if ((bVar1) && (bVar1 = PtIsOnLocus(loc2,(LLPoint *)local_100,1e-06), bVar1)) {
        intersect->latitude = ploc2.longitude;
        intersect->longitude = ploc1.latitude;
        loc1_local._4_4_ = 1;
      }
      else {
        loc1_local._4_4_ = 0;
      }
    }
    else {
      loc1_local._4_4_ = 0;
    }
  }
  else {
    loc1_local._4_4_ = 0;
  }
  return loc1_local._4_4_;
}

Assistant:

int LocusIntersect(const Locus &loc1, const Locus &loc2, LLPoint &intersect,
                       double dTol, double dEps)
    {
        InverseResult result;
        DistVincenty(loc1.locusStart, loc1.locusEnd, result);
        const double crs1 = result.azimuth;

        DistVincenty(loc2.locusStart, loc2.locusEnd, result);
        const double crs2 = result.azimuth;

        LLPoint p1;
        if (!CrsIntersect(loc1.locusStart, crs1, loc2.locusStart, crs2, dTol, p1))
            return 0;

        DistVincenty(loc1.geoStart, loc1.geoEnd, result);
        const double tcrs1 = result.azimuth;

        DistVincenty(loc2.geoStart, loc2.geoEnd, result);
        const double tcrs2 = result.azimuth;

        double dCrsFromPt, dDistFromP;
        LLPoint pint1 = PerpIntercept(loc1.geoStart, tcrs1, p1, dCrsFromPt, dDistFromP, dTol);

        PtIsOnGeodesicResult ptResult;
        if (!PtIsOnGeodesic(loc1.geoStart, loc1.geoEnd, pint1, 0, ptResult)
            || !ptResult.result)
            return 0;

        DistVincenty(loc1.geoStart, pint1, result);
        double distbase = result.distance;

        LLPoint ploc1, ploc2;
        double distarray[2], errarray[2];
        distarray[0] = distarray[1] = errarray[0] = errarray[1] = 0.0;


        const int maxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while ((k == 0) || (!std::isnan(distbase) && k < maxCount && fabs(dErr) > dTol))
        {
            if (k > 0)
                pint1 = DestVincenty(loc1.geoStart, tcrs1, distbase);
            ploc1 = PointOnLocusP(loc1, pint1, dTol, dEps);
            const LLPoint pint2 = PerpIntercept(loc2.geoStart, tcrs2, ploc1, dCrsFromPt, dDistFromP, dTol);

            ploc2 = PointOnLocusP(loc2, pint2, dTol, dEps);
            DistVincenty(ploc1, ploc2, result);
            dErr = result.distance;

            errarray[0] = errarray[1];
            errarray[1] = dErr;
            distarray[0] = distarray[1];
            distarray[1] = distbase;
            if (k == 0)
            {
                pint1 = PerpIntercept(loc1.geoStart, tcrs1, ploc2, dCrsFromPt, dDistFromP, dTol);
                DistVincenty(loc1.geoStart, pint1, result);
                distbase = result.distance;
            }
            else
            {
                FindLinearRoot(distarray, errarray, distbase);
            }
            k++;
        }

        if (!PtIsOnLocus(loc1, ploc1, 1e-6) || !PtIsOnLocus(loc2, ploc2, 1e-6))
            return 0;

        intersect = ploc1;
        return 1;
    }